

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O0

LY_ERR lyplg_type_store_bits
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  size_t sVar1;
  void *pvVar2;
  anon_union_24_16_e2776397_for_lyd_value_2 *__s;
  char *local_f0;
  long local_e0;
  long local_d0;
  long local_c8;
  long local_a8;
  long local_98;
  long local_90;
  long *local_58;
  char *p___1;
  char *p__;
  lyd_value_bits *val;
  lysc_type_bits *type_bits;
  LY_ERR ret;
  LY_VALUE_FORMAT format_local;
  uint32_t options_local;
  size_t value_len_local;
  void *value_local;
  lysc_type *type_local;
  ly_ctx *ctx_local;
  
  type_bits._4_4_ = LY_SUCCESS;
  memset(storage,0,0x28);
  __s = &storage->field_2;
  memset(__s,0,0x10);
  ret = options;
  if (__s == (anon_union_24_16_e2776397_for_lyd_value_2 *)0x0) {
    type_bits._4_4_ = LY_EMEM;
  }
  else {
    storage->realtype = type;
    if (format == LY_VALUE_LYB) {
      sVar1 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
      if (value_len == sVar1) {
        if ((options & 1) == 0) {
          pvVar2 = malloc(value_len);
          __s->dyn_mem = pvVar2;
          if (__s->dec64 == 0) {
            type_bits._4_4_ = LY_EMEM;
            goto LAB_002318f0;
          }
          memcpy(__s->dyn_mem,value,value_len);
        }
        else {
          __s->dyn_mem = value;
          ret = LY_SUCCESS;
        }
        if (*(long *)((long)&storage->field_2 + 8) == 0) {
          if (type[1].name == (char *)0x0) {
            local_98 = 0;
          }
          else {
            local_98 = *(long *)(type[1].name + -8);
          }
          p___1 = (char *)calloc(1,local_98 * 8 + 8);
          if (p___1 == (char *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_type_store_bits");
            type_bits._4_4_ = LY_EMEM;
            goto LAB_002318f0;
          }
        }
        else {
          if (type[1].name == (char *)0x0) {
            local_90 = 0;
          }
          else {
            local_90 = *(long *)(type[1].name + -8);
          }
          p___1 = (char *)realloc((void *)(*(long *)((long)&storage->field_2 + 8) + -8),
                                  (*(long *)(*(long *)((long)&storage->field_2 + 8) + -8) + local_90
                                  ) * 8 + 8);
          if (p___1 == (char *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_type_store_bits");
            type_bits._4_4_ = LY_EMEM;
            goto LAB_002318f0;
          }
        }
        *(char **)((long)&storage->field_2 + 8) = p___1 + 8;
        if (*(long *)((long)&storage->field_2 + 8) != 0) {
          if (type[1].name == (char *)0x0) {
            local_a8 = 0;
          }
          else {
            local_a8 = *(long *)(type[1].name + -8);
          }
          memset((void *)(*(long *)((long)&storage->field_2 + 8) + *(long *)p___1 * 8),0,
                 local_a8 << 3);
        }
        bits_bitmap2items((char *)__s->enum_item,(lysc_type_bits *)type,
                          *(lysc_type_bitenum_item ***)((long)&storage->field_2 + 8));
      }
      else {
        sVar1 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
        type_bits._4_4_ =
             ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                        "Invalid LYB bits value size %zu (expected %zu).",value_len,sVar1);
      }
    }
    else {
      type_bits._4_4_ =
           lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
      if (type_bits._4_4_ == LY_SUCCESS) {
        sVar1 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
        pvVar2 = malloc(sVar1);
        __s->dyn_mem = pvVar2;
        if (__s->dec64 == 0) {
          type_bits._4_4_ = LY_EMEM;
        }
        else {
          pvVar2 = __s->dyn_mem;
          sVar1 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
          memset(pvVar2,0,sVar1);
          type_bits._4_4_ =
               bits_str2bitmap((char *)value,value_len,(lysc_type_bits *)type,(char *)__s->enum_item
                               ,err);
          if (type_bits._4_4_ == LY_SUCCESS) {
            if (*(long *)((long)&storage->field_2 + 8) == 0) {
              if (type[1].name == (char *)0x0) {
                local_d0 = 0;
              }
              else {
                local_d0 = *(long *)(type[1].name + -8);
              }
              local_58 = (long *)calloc(1,local_d0 * 8 + 8);
              if (local_58 == (long *)0x0) {
                ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lyplg_type_store_bits");
                type_bits._4_4_ = LY_EMEM;
                goto LAB_002318f0;
              }
            }
            else {
              if (type[1].name == (char *)0x0) {
                local_c8 = 0;
              }
              else {
                local_c8 = *(long *)(type[1].name + -8);
              }
              local_58 = (long *)realloc((void *)(*(long *)((long)&storage->field_2 + 8) + -8),
                                         (*(long *)(*(long *)((long)&storage->field_2 + 8) + -8) +
                                         local_c8) * 8 + 8);
              if (local_58 == (long *)0x0) {
                ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lyplg_type_store_bits");
                type_bits._4_4_ = LY_EMEM;
                goto LAB_002318f0;
              }
            }
            *(long **)((long)&storage->field_2 + 8) = local_58 + 1;
            if (*(long *)((long)&storage->field_2 + 8) != 0) {
              if (type[1].name == (char *)0x0) {
                local_e0 = 0;
              }
              else {
                local_e0 = *(long *)(type[1].name + -8);
              }
              memset((void *)(*(long *)((long)&storage->field_2 + 8) + *local_58 * 8),0,
                     local_e0 << 3);
            }
            bits_bitmap2items((char *)__s->enum_item,(lysc_type_bits *)type,
                              *(lysc_type_bitenum_item ***)((long)&storage->field_2 + 8));
            if (format == LY_VALUE_CANON) {
              if ((options & 1) == 0) {
                local_f0 = (char *)value;
                if (value_len == 0) {
                  local_f0 = "";
                }
                type_bits._4_4_ = lydict_insert(ctx,local_f0,value_len,&storage->_canonical);
              }
              else {
                type_bits._4_4_ = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
                ret = LY_SUCCESS;
              }
            }
          }
        }
      }
    }
  }
LAB_002318f0:
  if ((ret & LY_EMEM) != LY_SUCCESS) {
    free(value);
  }
  if (type_bits._4_4_ != LY_SUCCESS) {
    lyplg_type_free_bits(ctx,storage);
  }
  return type_bits._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_bits(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type_bits *type_bits = (struct lysc_type_bits *)type;
    struct lyd_value_bits *val;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len != lyplg_type_bits_bitmap_size(type_bits)) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB bits value size %zu (expected %zu).",
                    value_len, lyplg_type_bits_bitmap_size(type_bits));
            goto cleanup;
        }

        /* store value (bitmap) */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            val->bitmap = (char *)value;
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
        } else {
            val->bitmap = malloc(value_len);
            LY_CHECK_ERR_GOTO(!val->bitmap, ret = LY_EMEM, cleanup);
            memcpy(val->bitmap, value, value_len);
        }

        /* allocate and fill the bit item array */
        LY_ARRAY_CREATE_GOTO(ctx, val->items, LY_ARRAY_COUNT(type_bits->bits), ret, cleanup);
        bits_bitmap2items(val->bitmap, type_bits, val->items);

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* allocate the bitmap */
    val->bitmap = malloc(lyplg_type_bits_bitmap_size(type_bits));
    LY_CHECK_ERR_GOTO(!val->bitmap, ret = LY_EMEM, cleanup);
    memset(val->bitmap, 0, lyplg_type_bits_bitmap_size(type_bits));

    /* fill the bitmap */
    ret = bits_str2bitmap(value, value_len, type_bits, val->bitmap, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* allocate and fill the bit item array */
    LY_ARRAY_CREATE_GOTO(ctx, val->items, LY_ARRAY_COUNT(type_bits->bits), ret, cleanup);
    bits_bitmap2items(val->bitmap, type_bits, val->items);

    if (format == LY_VALUE_CANON) {
        /* store canonical value */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret != LY_SUCCESS, cleanup);
        }
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_bits(ctx, storage);
    }
    return ret;
}